

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSAXMLScanner.cpp
# Opt level: O1

bool __thiscall xercesc_4_0::XSAXMLScanner::scanStartTag(XSAXMLScanner *this,bool *gotData)

{
  ElemStack *this_00;
  XMLBufferMgr *this_01;
  short *psVar1;
  bool bVar2;
  ReaderMgr *pRVar3;
  Grammar *pGVar4;
  XMLStringPool *pXVar5;
  XMLValidator *pXVar6;
  MemoryManager *pMVar7;
  XMLDocumentHandler *pXVar8;
  bool bVar9;
  bool bVar10;
  XMLCh XVar11;
  int iVar12;
  uint uVar13;
  GrammarType GVar14;
  StackElem *pSVar15;
  int *piVar16;
  ComplexTypeInfo **ppCVar17;
  XMLContentModel *pXVar18;
  undefined4 extraout_var_00;
  undefined7 extraout_var;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  XMLCh *pXVar19;
  undefined4 extraout_var_03;
  SchemaElementDecl *this_02;
  XMLCh *pXVar20;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  ComplexTypeInfo *pCVar21;
  XMLBuffer *pXVar22;
  XMLSize_t XVar23;
  XMLCh *pXVar24;
  undefined4 extraout_var_06;
  size_t __n;
  long lVar25;
  ulong uVar26;
  uint uVar27;
  XMLSize_t XVar28;
  bool bVar29;
  bool isEmpty;
  uint local_bc;
  uint local_b8;
  int prefixColonPos;
  undefined8 local_b0;
  ElemStack *local_a8;
  XMLSize_t local_a0;
  XMLSize_t local_98;
  XMLSize_t local_90;
  MemoryManager *local_88;
  bool *local_80;
  QName element;
  ContentLeafNameTypeVector *cv;
  
  *gotData = true;
  (this->super_SGXMLScanner).fContent.fIndex = 0;
  pRVar3 = &(this->super_SGXMLScanner).super_XMLScanner.fReaderMgr;
  pXVar22 = &(this->super_SGXMLScanner).super_XMLScanner.fQNameBuf;
  (this->super_SGXMLScanner).super_XMLScanner.fQNameBuf.fIndex = 0;
  bVar9 = XMLReader::getQName((this->super_SGXMLScanner).super_XMLScanner.fReaderMgr.fCurReader,
                              pXVar22,&prefixColonPos);
  if (!bVar9) {
    XVar23 = pXVar22->fIndex;
    if (XVar23 == 0) {
      XMLScanner::emitError((XMLScanner *)this,ExpectedElementName);
    }
    else {
      pXVar24 = (this->super_SGXMLScanner).super_XMLScanner.fQNameBuf.fBuffer;
      pXVar24[XVar23] = L'\0';
      XMLScanner::emitError
                ((XMLScanner *)this,InvalidElementName,pXVar24,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
    do {
      XVar11 = ReaderMgr::getNextChar(pRVar3);
      if (XVar11 == L'\0') {
        return bVar9;
      }
    } while (XVar11 != L'<');
    return bVar9;
  }
  this_00 = &(this->super_SGXMLScanner).super_XMLScanner.fElemStack;
  XVar23 = (this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStackTop;
  ReaderMgr::skipPastSpaces(pRVar3);
  pXVar24 = (this->super_SGXMLScanner).super_XMLScanner.fQNameBuf.fBuffer;
  pXVar24[(this->super_SGXMLScanner).super_XMLScanner.fQNameBuf.fIndex] = L'\0';
  local_a0 = SGXMLScanner::rawAttrScan
                       (&this->super_SGXMLScanner,pXVar24,(this->super_SGXMLScanner).fRawAttrList,
                        &isEmpty);
  local_b8 = 0xfffffffe;
  local_a8 = this_00;
  local_98 = XVar23;
  local_80 = gotData;
  if (XVar23 == 0) {
    local_b0 = 0;
    pXVar18 = (XMLContentModel *)0x0;
    cv = (ContentLeafNameTypeVector *)0x0;
  }
  else {
    pSVar15 = ElemStack::topElement(this_00);
    pCVar21 = (ComplexTypeInfo *)pSVar15->fThisElement[1].fId;
    piVar16 = (int *)&pSVar15->fThisElement->field_0x2c;
    if (pCVar21 != (ComplexTypeInfo *)0x0) {
      piVar16 = &pCVar21->fContentType;
    }
    if ((this->super_SGXMLScanner).super_XMLScanner.fValidate == true) {
      pRVar3 = (this->super_SGXMLScanner).super_XMLScanner.fValidator[4].fReaderMgr;
      if (pRVar3->fCurReader == (XMLReader *)0x0) {
        pCVar21 = (ComplexTypeInfo *)0x0;
      }
      else {
        ppCVar17 = ValueStackOf<xercesc_4_0::ComplexTypeInfo_*>::peek
                             ((ValueStackOf<xercesc_4_0::ComplexTypeInfo_*> *)pRVar3);
        pCVar21 = *ppCVar17;
      }
      if (pCVar21 == (ComplexTypeInfo *)0x0) {
        uVar26 = 1;
        pCVar21 = (ComplexTypeInfo *)0x0;
      }
      else {
        uVar26 = (ulong)(uint)pCVar21->fContentType;
      }
    }
    else {
      uVar26 = (ulong)(uint)*piVar16;
    }
    if ((int)uVar26 - 2U < 3) {
      if ((pCVar21->fContentModel == (XMLContentModel *)0x0) &&
         (pCVar21->fContentSpec != (ContentSpecNode *)0x0)) {
        pXVar18 = ComplexTypeInfo::makeContentModel(pCVar21,false);
        pCVar21->fContentModel = pXVar18;
      }
      pXVar18 = pCVar21->fContentModel;
      iVar12 = (*pXVar18->_vptr_XMLContentModel[5])(pXVar18);
      cv = (ContentLeafNameTypeVector *)CONCAT44(extraout_var_00,iVar12);
      local_b8 = (this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStack
                 [(this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStackTop - 1]->
                 fCurrentScope;
      local_b0 = 0;
    }
    else {
      if ((int)uVar26 == 1) {
        local_b0 = CONCAT71((int7)(uVar26 >> 8),1);
      }
      else {
        local_b0 = 0;
      }
      pXVar18 = (XMLContentModel *)0x0;
      cv = (ContentLeafNameTypeVector *)0x0;
    }
  }
  local_90 = ElemStack::addLevel(local_a8);
  pSVar15 = (this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStack
            [(this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStackTop - 1];
  pSVar15->fValidationFlag = (this->super_SGXMLScanner).super_XMLScanner.fValidate;
  pSVar15->fPrefixColonPos = prefixColonPos;
  if (local_a0 != 0) {
    scanRawAttrListforNameSpaces(this,local_a0);
  }
  local_bc = XMLScanner::resolveQNameWithColon
                       ((XMLScanner *)this,pXVar24,
                        &(this->super_SGXMLScanner).super_XMLScanner.fPrefixBuf,Mode_Element,
                        prefixColonPos);
  bVar2 = (this->super_SGXMLScanner).super_XMLScanner.fValidate;
  if (cv != (ContentLeafNameTypeVector *)0x0) {
    pXVar20 = (this->super_SGXMLScanner).super_XMLScanner.fPrefixBuf.fBuffer;
    pXVar20[(this->super_SGXMLScanner).super_XMLScanner.fPrefixBuf.fIndex] = L'\0';
    QName::QName(&element,pXVar20,pXVar24 + (long)prefixColonPos + 1,local_bc,
                 (this->super_SGXMLScanner).super_XMLScanner.fMemoryManager);
    bVar10 = SGXMLScanner::laxElementValidation
                       (&this->super_SGXMLScanner,&element,cv,pXVar18,local_90 - 1);
    local_b0 = CONCAT71(extraout_var,bVar10);
    QName::~QName(&element);
  }
  uVar27 = local_bc;
  pXVar20 = pXVar24 + (long)prefixColonPos + 1;
  pGVar4 = (this->super_SGXMLScanner).super_XMLScanner.fGrammar;
  iVar12 = (*(pGVar4->super_XSerializable)._vptr_XSerializable[0xb])(pGVar4,(ulong)local_bc,pXVar20)
  ;
  this_02 = (SchemaElementDecl *)CONCAT44(extraout_var_01,iVar12);
  if (this_02 == (SchemaElementDecl *)0x0) {
    pXVar5 = (this->super_SGXMLScanner).super_XMLScanner.fURIStringPool;
    iVar12 = (*(((this->super_SGXMLScanner).super_XMLScanner.fGrammar)->super_XSerializable).
               _vptr_XSerializable[6])();
    uVar27 = local_bc;
    uVar13 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[9])
                       (pXVar5,CONCAT44(extraout_var_02,iVar12));
    if (uVar27 != uVar13) {
      pXVar19 = XMLScanner::getURIText((XMLScanner *)this,uVar27);
      switchGrammar(this,pXVar19,local_b0._0_1_);
    }
    pGVar4 = (this->super_SGXMLScanner).super_XMLScanner.fGrammar;
    iVar12 = (*(pGVar4->super_XSerializable)._vptr_XSerializable[0xb])(pGVar4,(ulong)uVar27,pXVar20)
    ;
    this_02 = (SchemaElementDecl *)CONCAT44(extraout_var_03,iVar12);
    if ((this_02 == (SchemaElementDecl *)0x0) &&
       (this_02 = RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::
                  getByKey((this->super_SGXMLScanner).fElemNonDeclPool,pXVar20,uVar27,-2),
       this_02 == (SchemaElementDecl *)0x0)) {
      local_88 = (this->super_SGXMLScanner).super_XMLScanner.fMemoryManager;
      this_02 = (SchemaElementDecl *)XMemory::operator_new(0x80,local_88);
      pXVar19 = (this->super_SGXMLScanner).super_XMLScanner.fPrefixBuf.fBuffer;
      pXVar19[(this->super_SGXMLScanner).super_XMLScanner.fPrefixBuf.fIndex] = L'\0';
      SchemaElementDecl::SchemaElementDecl
                (this_02,pXVar19,pXVar20,uVar27,Any,0xfffffffe,
                 (this->super_SGXMLScanner).super_XMLScanner.fMemoryManager);
      XVar23 = RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::put
                         ((this->super_SGXMLScanner).fElemNonDeclPool,
                          ((this_02->super_XMLElementDecl).fElementName)->fLocalPart,uVar27,-2,
                          this_02);
      (this_02->super_XMLElementDecl).fId = XVar23;
      bVar10 = true;
      goto LAB_002cb3f2;
    }
  }
  bVar10 = false;
LAB_002cb3f2:
  pXVar6 = (this->super_SGXMLScanner).super_XMLScanner.fValidator;
  if (pXVar6 == (XMLValidator *)0x0) {
    bVar29 = false;
  }
  else {
    bVar29 = pXVar6[1].fReaderMgr != (ReaderMgr *)0x0;
  }
  if ((bVar10) || ((this_02->super_XMLElementDecl).fCreateReason != Declared)) {
    if ((char)local_b0 == '\x01' && !bVar29) {
      (this->super_SGXMLScanner).super_XMLScanner.fValidate = false;
      (this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStack
      [(this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStackTop - 1]->fValidationFlag =
           false;
    }
    if (((this->super_SGXMLScanner).super_XMLScanner.fValidate == true) &&
       ((this_02->super_XMLElementDecl).fCreateReason = JustFaultIn, !bVar29)) {
      pXVar20 = QName::getRawName((this_02->super_XMLElementDecl).fElementName);
      XMLValidator::emitError
                (pXVar6,ElementNotDefined,pXVar20,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    }
  }
  ElemStack::setElement
            (local_a8,&this_02->super_XMLElementDecl,
             ((this->super_SGXMLScanner).super_XMLScanner.fReaderMgr.fCurReader)->fReaderNum);
  (this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStack
  [(this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStackTop - 1]->fCurrentURI = uVar27;
  if (local_98 == 0) {
    if (pXVar24 == (XMLCh *)0x0) {
      pXVar20 = (XMLCh *)0x0;
    }
    else {
      pMVar7 = (this->super_SGXMLScanner).super_XMLScanner.fMemoryManager;
      __n = 0;
      do {
        psVar1 = (short *)((long)pXVar24 + __n);
        __n = __n + 2;
      } while (*psVar1 != 0);
      iVar12 = (*pMVar7->_vptr_MemoryManager[3])(pMVar7,__n);
      pXVar20 = (XMLCh *)CONCAT44(extraout_var_04,iVar12);
      memcpy(pXVar20,pXVar24,__n);
    }
    (this->super_SGXMLScanner).super_XMLScanner.fRootElemName = pXVar20;
  }
  if ((this->super_SGXMLScanner).super_XMLScanner.fValidate == true) {
    (*((this->super_SGXMLScanner).super_XMLScanner.fValidator)->_vptr_XMLValidator[9])();
  }
  pXVar24 = (this->super_SGXMLScanner).super_XMLScanner.fQNameBuf.fBuffer;
  pXVar24[(this->super_SGXMLScanner).super_XMLScanner.fQNameBuf.fIndex] = L'\0';
  if (pXVar24 == (XMLCh *)0x0) {
    uVar26 = 0;
  }
  else {
    lVar25 = 0;
    do {
      psVar1 = (short *)((long)pXVar24 + lVar25);
      lVar25 = lVar25 + 2;
    } while (*psVar1 != 0);
    uVar26 = (lVar25 >> 1) - 1;
  }
  XVar23 = (this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStackTop;
  pSVar15 = (this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStack[XVar23 - 1];
  XVar28 = local_98;
  if (pSVar15->fSchemaElemNameMaxLen <= uVar26) {
    pXVar20 = pSVar15->fSchemaElemName;
    pSVar15->fSchemaElemNameMaxLen = uVar26 * 2;
    pMVar7 = (this->super_SGXMLScanner).super_XMLScanner.fElemStack.fMemoryManager;
    iVar12 = (*pMVar7->_vptr_MemoryManager[3])(pMVar7,uVar26 << 2);
    XVar28 = local_98;
    (this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStack[XVar23 - 1]->fSchemaElemName =
         (XMLCh *)CONCAT44(extraout_var_05,iVar12);
    pMVar7 = (this->super_SGXMLScanner).super_XMLScanner.fElemStack.fMemoryManager;
    (*pMVar7->_vptr_MemoryManager[4])(pMVar7,pXVar20);
  }
  XMLString::copyString
            ((this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStack[XVar23 - 1]->
             fSchemaElemName,pXVar24);
  XVar23 = local_a0;
  uVar27 = local_bc;
  if ((this->super_SGXMLScanner).super_XMLScanner.fValidate == true) {
    pRVar3 = (this->super_SGXMLScanner).super_XMLScanner.fValidator[4].fReaderMgr;
    if (pRVar3->fCurReader == (XMLReader *)0x0) {
      pCVar21 = (ComplexTypeInfo *)0x0;
    }
    else {
      ppCVar17 = ValueStackOf<xercesc_4_0::ComplexTypeInfo_*>::peek
                           ((ValueStackOf<xercesc_4_0::ComplexTypeInfo_*> *)pRVar3);
      pCVar21 = *ppCVar17;
    }
  }
  else {
    pCVar21 = this_02->fComplexTypeInfo;
  }
  if (pCVar21 != (ComplexTypeInfo *)0x0) {
    local_b8 = pCVar21->fScopeDefined;
    pXVar24 = pCVar21->fTypeName;
    uVar13 = XMLString::indexOf(pXVar24,L',');
    XVar23 = local_a0;
    uVar27 = local_bc;
    if (0 < (int)uVar13) {
      this_01 = &(this->super_SGXMLScanner).super_XMLScanner.fBufMgr;
      pXVar22 = XMLBufferMgr::bidOnBuffer(this_01);
      element.super_XSerializable._vptr_XSerializable = (_func_int **)pXVar22;
      element.fPrefixBufSz = (XMLSize_t)this_01;
      XMLBuffer::append(pXVar22,pXVar24,(ulong)uVar13);
      pXVar24 = pXVar22->fBuffer;
      pXVar24[pXVar22->fIndex] = L'\0';
      switchGrammar(this,pXVar24,local_b0._0_1_);
      XMLBufferMgr::releaseBuffer
                ((XMLBufferMgr *)element.fPrefixBufSz,
                 (XMLBuffer *)element.super_XSerializable._vptr_XSerializable);
      XVar23 = local_a0;
      XVar28 = local_98;
      uVar27 = local_bc;
    }
  }
  (this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStack
  [(this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStackTop - 1]->fCurrentScope = local_b8;
  if ((this->super_SGXMLScanner).fElemStateSize <= local_90) {
    SGXMLScanner::resizeElemState(&this->super_SGXMLScanner);
  }
  (this->super_SGXMLScanner).fElemState[local_90] = 0;
  (this->super_SGXMLScanner).fElemLoopState[local_90] = 0;
  (this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStack
  [(this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStackTop - 1]->fCurrentGrammar =
       (this->super_SGXMLScanner).super_XMLScanner.fGrammar;
  if ((XVar28 != 0) && (bVar2 != false)) {
    ElemStack::addChild(local_a8,(this_02->super_XMLElementDecl).fElementName,true);
  }
  XVar23 = SGXMLScanner::buildAttList
                     (&this->super_SGXMLScanner,(this->super_SGXMLScanner).fRawAttrList,XVar23,
                      &this_02->super_XMLElementDecl,
                      (this->super_SGXMLScanner).super_XMLScanner.fAttrList);
  if (XVar23 != 0) {
    Hash2KeysSetOf<xercesc_4_0::StringHasher>::removeAll
              ((this->super_SGXMLScanner).fUndeclaredAttrRegistry);
  }
  pXVar8 = (this->super_SGXMLScanner).super_XMLScanner.fDocHandler;
  if (pXVar8 != (XMLDocumentHandler *)0x0) {
    pXVar24 = (this->super_SGXMLScanner).super_XMLScanner.fPrefixBuf.fBuffer;
    pXVar24[(this->super_SGXMLScanner).super_XMLScanner.fPrefixBuf.fIndex] = L'\0';
    (*pXVar8->_vptr_XMLDocumentHandler[0xb])
              (pXVar8,this_02,(ulong)uVar27,pXVar24,
               (this->super_SGXMLScanner).super_XMLScanner.fAttrList,XVar23,0,(ulong)(XVar28 == 0));
  }
  if (isEmpty == true) {
    ElemStack::popTop(local_a8);
    if (((this->super_SGXMLScanner).super_XMLScanner.fValidate == true) &&
       (pXVar6 = (this->super_SGXMLScanner).super_XMLScanner.fValidator,
       iVar12 = (*pXVar6->_vptr_XMLValidator[2])(pXVar6,this_02,0,0), (char)iVar12 == '\0')) {
      pXVar6 = (this->super_SGXMLScanner).super_XMLScanner.fValidator;
      pXVar24 = QName::getRawName((this_02->super_XMLElementDecl).fElementName);
      iVar12 = (*(this_02->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[0xd])
                         (this_02);
      XVar28 = local_98;
      XMLValidator::emitError
                (pXVar6,ElementNotValidForContent,pXVar24,(XMLCh *)CONCAT44(extraout_var_06,iVar12),
                 (XMLCh *)0x0,(XMLCh *)0x0);
    }
    pXVar8 = (this->super_SGXMLScanner).super_XMLScanner.fDocHandler;
    if (pXVar8 != (XMLDocumentHandler *)0x0) {
      (this->super_SGXMLScanner).super_XMLScanner.fPrefixBuf.fBuffer
      [(this->super_SGXMLScanner).super_XMLScanner.fPrefixBuf.fIndex] = L'\0';
      (*pXVar8->_vptr_XMLDocumentHandler[6])(pXVar8,this_02,(ulong)uVar27,(ulong)(XVar28 == 0));
    }
    if (XVar28 == 0) {
      *local_80 = false;
    }
    else {
      pGVar4 = (this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStack
               [(this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStackTop - 1]->
               fCurrentGrammar;
      (this->super_SGXMLScanner).super_XMLScanner.fGrammar = pGVar4;
      GVar14 = (*(pGVar4->super_XSerializable)._vptr_XSerializable[5])();
      (this->super_SGXMLScanner).fGrammarType = GVar14;
      pXVar6 = (this->super_SGXMLScanner).super_XMLScanner.fValidator;
      (*pXVar6->_vptr_XMLValidator[0xb])
                (pXVar6,(this->super_SGXMLScanner).super_XMLScanner.fGrammar);
      (this->super_SGXMLScanner).super_XMLScanner.fValidate =
           (this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStack
           [(this->super_SGXMLScanner).super_XMLScanner.fElemStack.fStackTop - 1]->fValidationFlag;
    }
  }
  return bVar9;
}

Assistant:

bool XSAXMLScanner::scanStartTag(bool& gotData)
{
    //  Assume we will still have data until proven otherwise. It will only
    //  ever be false if this is the root and its empty.
    gotData = true;

    // Reset element content
    fContent.reset();

    //  The current position is after the open bracket, so we need to read in
    //  in the element name.
    int prefixColonPos;
    if (!fReaderMgr.getQName(fQNameBuf, &prefixColonPos))
    {
        if (fQNameBuf.isEmpty())
            emitError(XMLErrs::ExpectedElementName);
        else
            emitError(XMLErrs::InvalidElementName, fQNameBuf.getRawBuffer());
        fReaderMgr.skipToChar(chOpenAngle);
        return false;
    }

    // See if its the root element
    const bool isRoot = fElemStack.isEmpty();

    // Skip any whitespace after the name
    fReaderMgr.skipPastSpaces();

    //  First we have to do the rawest attribute scan. We don't do any
    //  normalization of them at all, since we don't know yet what type they
    //  might be (since we need the element decl in order to do that.)
    const XMLCh* qnameRawBuf = fQNameBuf.getRawBuffer();
    bool isEmpty;
    XMLSize_t attCount = rawAttrScan(qnameRawBuf, *fRawAttrList, isEmpty);

    // save the contentleafname and currentscope before addlevel, for later use
    ContentLeafNameTypeVector* cv = 0;
    XMLContentModel* cm = 0;
    unsigned int currentScope = Grammar::TOP_LEVEL_SCOPE;
    bool laxThisOne = false;
    if (!isRoot)
    {
        // schema validator will have correct type if validating
        SchemaElementDecl* tempElement = (SchemaElementDecl*)
            fElemStack.topElement()->fThisElement;
        SchemaElementDecl::ModelTypes modelType = tempElement->getModelType();
        ComplexTypeInfo *currType = 0;

        if (fValidate)
        {
            currType = ((SchemaValidator*)fValidator)->getCurrentTypeInfo();
            if (currType)
                modelType = (SchemaElementDecl::ModelTypes)currType->getContentType();
            else // something must have gone wrong
                modelType = SchemaElementDecl::Any;
        }
        else {
            currType = tempElement->getComplexTypeInfo();
        }

        if ((modelType == SchemaElementDecl::Mixed_Simple)
          ||  (modelType == SchemaElementDecl::Mixed_Complex)
          ||  (modelType == SchemaElementDecl::Children))
        {
            cm = currType->getContentModel();
            cv = cm->getContentLeafNameTypeVector();
            currentScope = fElemStack.getCurrentScope();
        }
        else if (modelType == SchemaElementDecl::Any) {
            laxThisOne = true;
        }
    }

    //  Now, since we might have to update the namespace map for this element,
    //  but we don't have the element decl yet, we just tell the element stack
    //  to expand up to get ready.
    XMLSize_t elemDepth = fElemStack.addLevel();
    fElemStack.setValidationFlag(fValidate);
    fElemStack.setPrefixColonPos(prefixColonPos);

    //  Make an initial pass through the list and find any xmlns attributes or
    //  schema attributes.
    if (attCount)
        scanRawAttrListforNameSpaces(attCount);

    //  Resolve the qualified name to a URI and name so that we can look up
    //  the element decl for this element. We have now update the prefix to
    //  namespace map so we should get the correct element now.
    unsigned int uriId = resolveQNameWithColon
    (
        qnameRawBuf, fPrefixBuf, ElemStack::Mode_Element, prefixColonPos
    );

    //if schema, check if we should lax or skip the validation of this element
    bool parentValidation = fValidate;
    if (cv) {
        QName element(fPrefixBuf.getRawBuffer(), &qnameRawBuf[prefixColonPos + 1], uriId, fMemoryManager);
        // elementDepth will be > 0, as cv is only constructed if element is not
        // root.
        laxThisOne = laxElementValidation(&element, cv, cm, elemDepth - 1);
    }

    //  Look up the element now in the grammar. This will get us back a
    //  generic element decl object. We tell him to fault one in if he does
    //  not find it.
    bool wasAdded = false;
    const XMLCh* nameRawBuf = &qnameRawBuf[prefixColonPos + 1];
    XMLElementDecl* elemDecl = fGrammar->getElemDecl
    (
        uriId, nameRawBuf, qnameRawBuf, currentScope
    );

    if (!elemDecl)
    {
        // URI is different, so we try to switch grammar
        if (uriId != fURIStringPool->getId(fGrammar->getTargetNamespace())) {
            switchGrammar(getURIText(uriId), laxThisOne);
        }

        // look for a global element declaration
        elemDecl = fGrammar->getElemDecl(
            uriId, nameRawBuf, qnameRawBuf, Grammar::TOP_LEVEL_SCOPE
        );

        if (!elemDecl)
        {
            // if still not found, look in list of undeclared elements
            elemDecl = fElemNonDeclPool->getByKey(
                nameRawBuf, uriId, (int)Grammar::TOP_LEVEL_SCOPE);

            if (!elemDecl)
            {
                elemDecl = new (fMemoryManager) SchemaElementDecl
                (
                    fPrefixBuf.getRawBuffer(), nameRawBuf, uriId
                    , SchemaElementDecl::Any, Grammar::TOP_LEVEL_SCOPE
                    , fMemoryManager
                );

                elemDecl->setId (fElemNonDeclPool->put(
                      (void*)elemDecl->getBaseName(),
                      uriId,
                      (int)Grammar::TOP_LEVEL_SCOPE,
                      (SchemaElementDecl*)elemDecl));

                wasAdded = true;
            }
		}
    }

    //  We do something different here according to whether we found the
    //  element or not.
    bool bXsiTypeSet= (fValidator)?((SchemaValidator*)fValidator)->getIsXsiTypeSet():false;
    if (wasAdded || !elemDecl->isDeclared())
    {
        if (laxThisOne && !bXsiTypeSet) {
            fValidate = false;
            fElemStack.setValidationFlag(fValidate);
        }

        // If validating then emit an error
        if (fValidate)
        {
            // This is to tell the reuse Validator that this element was
            // faulted-in, was not an element in the grammar pool originally
            elemDecl->setCreateReason(XMLElementDecl::JustFaultIn);

            if(!bXsiTypeSet)
                fValidator->emitError
                (
                    XMLValid::ElementNotDefined, elemDecl->getFullName()
                );
        }
    }

    //  Now we can update the element stack to set the current element
    //  decl. We expanded the stack above, but couldn't store the element
    //  decl because we didn't know it yet.
    fElemStack.setElement(elemDecl, fReaderMgr.getCurrentReaderNum());
    fElemStack.setCurrentURI(uriId);

    if (isRoot) {
        fRootElemName = XMLString::replicate(qnameRawBuf, fMemoryManager);
    }

    //  Validate the element
    if (fValidate) {
        fValidator->validateElement(elemDecl);
    }

    // squirrel away the element's QName, so that we can do an efficient
    // end-tag match
    fElemStack.setCurrentSchemaElemName(fQNameBuf.getRawBuffer());

    ComplexTypeInfo* typeinfo = (fValidate)
        ? ((SchemaValidator*)fValidator)->getCurrentTypeInfo()
        : ((SchemaElementDecl*) elemDecl)->getComplexTypeInfo();

    if (typeinfo)
    {
        currentScope = typeinfo->getScopeDefined();

        // switch grammar if the typeinfo has a different grammar
        XMLCh* typeName = typeinfo->getTypeName();
        int comma = XMLString::indexOf(typeName, chComma);
        if (comma > 0)
        {
            XMLBufBid bbPrefix(&fBufMgr);
            XMLBuffer& prefixBuf = bbPrefix.getBuffer();

            prefixBuf.append(typeName, comma);
            switchGrammar(prefixBuf.getRawBuffer(), laxThisOne);
        }
    }
    fElemStack.setCurrentScope(currentScope);

    // Set element next state
    if (elemDepth >= fElemStateSize) {
        resizeElemState();
    }

    fElemState[elemDepth] = 0;
    fElemLoopState[elemDepth] = 0;
    fElemStack.setCurrentGrammar(fGrammar);

    //  If this is the first element and we are validating, check the root
    //  element.
    if (!isRoot && parentValidation) {
        fElemStack.addChild(elemDecl->getElementName(), true);
    }

    //  Now lets get the fAttrList filled in. This involves faulting in any
    //  defaulted and fixed attributes and normalizing the values of any that
    //  we got explicitly.
    //
    //  We update the attCount value with the total number of attributes, but
    //  it goes in with the number of values we got during the raw scan of
    //  explictly provided attrs above.
    attCount = buildAttList(*fRawAttrList, attCount, elemDecl, *fAttrList);

    if(attCount)
    {
        // clean up after ourselves:
        // clear the map used to detect duplicate attributes
        fUndeclaredAttrRegistry->removeAll();
    }

    // Since the element may have default values, call start tag now regardless if it is empty or not
    // If we have a document handler, then tell it about this start tag
    if (fDocHandler)
    {
        fDocHandler->startElement
        (
            *elemDecl, uriId, fPrefixBuf.getRawBuffer(), *fAttrList
            , attCount, false, isRoot
        );
    } // may be where we output something...

    //  If empty, validate content right now if we are validating and then
    //  pop the element stack top. Else, we have to update the current stack
    //  top's namespace mapping elements.
    if (isEmpty)
    {
        // Pop the element stack back off since it'll never be used now
        fElemStack.popTop();

        // If validating, then insure that its legal to have no content
        if (fValidate)
        {
            XMLSize_t failure;
            bool res = fValidator->checkContent(elemDecl, 0, 0, &failure);
            if (!res)
            {
                // REVISIT:  in the case of xsi:type, this may
                // return the wrong string...
                fValidator->emitError
                (
                    XMLValid::ElementNotValidForContent
                    , elemDecl->getFullName()
                    , elemDecl->getFormattedContentModel()
                );
            }
        }

        // If we have a doc handler, tell it about the end tag
        if (fDocHandler)
        {
            fDocHandler->endElement
            (
                *elemDecl, uriId, isRoot, fPrefixBuf.getRawBuffer()
            );
        }

        // If the elem stack is empty, then it was an empty root
        if (isRoot) {
            gotData = false;
        }
        else
        {
            // Restore the grammar
            fGrammar = fElemStack.getCurrentGrammar();
            fGrammarType = fGrammar->getGrammarType();
            fValidator->setGrammar(fGrammar);

            // Restore the validation flag
            fValidate = fElemStack.getValidationFlag();
        }
    }

    return true;
}